

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileProfilingData.h
# Opt level: O0

void __thiscall
cmMakefileProfilingData::RAII::RAII<char_const(&)[8],char_const(&)[9]>
          (RAII *this,cmMakefileProfilingData *data,char (*args) [8],char (*args_1) [9])

{
  cmMakefileProfilingData *this_00;
  char (*__s) [9];
  optional<Json::Value> local_b8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  char (*local_28) [9];
  char (*args_local_1) [9];
  char (*args_local) [8];
  cmMakefileProfilingData *data_local;
  RAII *this_local;
  
  this->Data = data;
  this_00 = this->Data;
  local_28 = args_1;
  args_local_1 = (char (*) [9])args;
  args_local = (char (*) [8])data;
  data_local = (cmMakefileProfilingData *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,*args,&local_49);
  __s = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,*__s,&local_81);
  std::optional<Json::Value>::optional();
  StartEntry(this_00,&local_48,&local_80,&local_b8);
  std::optional<Json::Value>::~optional(&local_b8);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return;
}

Assistant:

RAII(cmMakefileProfilingData& data, Args&&... args)
      : Data(&data)
    {
      this->Data->StartEntry(std::forward<Args>(args)...);
    }